

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3Interrogator.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IFF_Layer3Interrogator::Decode
          (IFF_Layer3Interrogator *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  StdVarPtr local_70;
  ushort local_58;
  undefined1 local_55;
  KUINT16 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  IFF_Layer3Interrogator *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x1c) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::clear(&(this->super_IFF_Layer3).m_vStdVarRecs);
  if ((local_19 & 1) == 0) {
    LayerHeader::Decode((LayerHeader *)this,pKStack_18);
  }
  pKVar2 = operator>>(pKStack_18,&(this->super_IFF_Layer3).m_RptSim.super_DataTypeBase);
  pKVar2 = operator>>(pKVar2,&(this->m_BasicData).super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_IFF_Layer3).m_ui16Padding);
  KDataStream::operator>>(pKVar2,&(this->super_IFF_Layer3).m_ui16NumIffRecs);
  for (local_58 = 0; local_58 < (this->super_IFF_Layer3).m_ui16NumIffRecs; local_58 = local_58 + 1)
  {
    StandardVariable::FactoryDecodeStandardVariable(&local_70,pKStack_18);
    std::
    vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
    ::push_back(&(this->super_IFF_Layer3).m_vStdVarRecs,&local_70);
    UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::~KRef_Ptr(&local_70);
  }
  return;
}

Assistant:

void IFF_Layer3Interrogator::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( stream.GetBufferSize() < IFF_LAYER3_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vStdVarRecs.clear();

	if( !ignoreHeader )
	{
		LayerHeader::Decode( stream );
	}

	stream >> KDIS_STREAM m_RptSim
		   >> KDIS_STREAM m_BasicData
		   >> m_ui16Padding
		   >> m_ui16NumIffRecs;

	// Use the factory decode function for each standard variable
    for( KUINT16 i = 0; i < m_ui16NumIffRecs; ++i )
    {
        m_vStdVarRecs.push_back( StandardVariable::FactoryDecodeStandardVariable( stream ) );
    }
}